

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

void __thiscall
tsbp::TwoStepBranchingProcedure::UpdateSolverStatistics
          (TwoStepBranchingProcedure *this,SolverStatistics *statistics)

{
  double *pdVar1;
  SolverStatistics *statistics_local;
  TwoStepBranchingProcedure *this_local;
  
  statistics->CallCountLMAO = (this->statistics).CallCountLMAO + statistics->CallCountLMAO;
  statistics->NodeCountLMAO = (this->statistics).NodeCountLMAO + statistics->NodeCountLMAO;
  statistics->TimeLMAO = (this->statistics).TimeLMAO + statistics->TimeLMAO;
  statistics->NodeCountTSBP = (this->statistics).NodeCountTSBP + statistics->NodeCountTSBP;
  statistics->TimeTSBP = (this->statistics).TimeTSBP + statistics->TimeTSBP;
  statistics->TimeMemoryDeallocation =
       (this->statistics).TimeMemoryDeallocation + statistics->TimeMemoryDeallocation;
  pdVar1 = std::max<double>(&statistics->MemoryUsage,&(this->statistics).MemoryUsage);
  statistics->MemoryUsage = *pdVar1;
  return;
}

Assistant:

void TwoStepBranchingProcedure::UpdateSolverStatistics(SolverStatistics& statistics) const
{
    statistics.CallCountLMAO += this->statistics.CallCountLMAO;
    statistics.NodeCountLMAO += this->statistics.NodeCountLMAO;
    statistics.TimeLMAO += this->statistics.TimeLMAO;

    statistics.NodeCountTSBP += this->statistics.NodeCountTSBP;
    statistics.TimeTSBP += this->statistics.TimeTSBP;

    statistics.TimeMemoryDeallocation += this->statistics.TimeMemoryDeallocation;

    statistics.MemoryUsage = std::max<double>(statistics.MemoryUsage, this->statistics.MemoryUsage);
}